

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::compiler::Version::ByteSizeLong(Version *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) == 0) {
    sVar6 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar6 = 0;
    }
    else {
      lVar3 = *(long *)(((ulong)(this->suffix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar5 = (uint)lVar3 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = lVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      uVar4 = (long)this->major_ | 1;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 4) != 0) {
      uVar4 = (long)this->minor_ | 1;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 8) != 0) {
      uVar4 = (long)this->patch_ | 1;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar6,&this->_cached_size_);
  return sVar6;
}

Assistant:

size_t Version::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.Version)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    // optional string suffix = 4;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_suffix());
    }

    // optional int32 major = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_major());
    }

    // optional int32 minor = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_minor());
    }

    // optional int32 patch = 3;
    if (cached_has_bits & 0x00000008u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_patch());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}